

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# beagle.cpp
# Opt level: O1

int scoreFlags(long flags1,long flags2)

{
  int iVar1;
  int iVar2;
  int iVar3;
  
  iVar1 = 0;
  iVar2 = 1;
  iVar3 = 0x20;
  do {
    iVar1 = iVar1 + (uint)((iVar2 & flags2) != 0 && (iVar2 & flags1) != 0);
    iVar2 = iVar2 * 2;
    iVar3 = iVar3 + -1;
  } while (iVar3 != 0);
  return -iVar1;
}

Assistant:

int scoreFlags(long flags1, long flags2) {
    int score = 0;
    int trait = 1;
    for(int bits=0; bits<32; bits++) {
        if ( (flags1 & trait) &&
             (flags2 & trait) )
            score++;
        trait <<= 1;
    }
    return -score;
}